

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O1

bool __thiscall
rlottie::internal::model::Rect::roundnessChanged(Rect *this,int prevFrame,int curFrame)

{
  RoundedCorner *pRVar1;
  byte bVar2;
  undefined8 *puVar3;
  
  pRVar1 = this->mRoundedCorner;
  if (pRVar1 == (RoundedCorner *)0x0) {
    if ((this->mRound).isValue_ == false) {
      puVar3 = *(undefined8 **)&(this->mRound).impl_.value_;
      goto LAB_0012e41b;
    }
  }
  else if ((pRVar1->mRadius).isValue_ == false) {
    puVar3 = *(undefined8 **)&(pRVar1->mRadius).impl_.value_;
LAB_0012e41b:
    if ((*(float *)*puVar3 <= (float)prevFrame) || (*(float *)*puVar3 <= (float)curFrame)) {
      bVar2 = -((float)curFrame <= *(float *)(puVar3[1] + -0x14) ||
               (float)prevFrame <= *(float *)(puVar3[1] + -0x14));
      goto LAB_0012e453;
    }
  }
  bVar2 = 0;
LAB_0012e453:
  return (bool)(bVar2 & 1);
}

Assistant:

bool roundnessChanged(int prevFrame, int curFrame)
    {
        return mRoundedCorner ? mRoundedCorner->mRadius.changed(prevFrame, curFrame) :
                        mRound.changed(prevFrame, curFrame);
    }